

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O1

void __thiscall TasgridWrapper::outputIndexes(TasgridWrapper *this,output_points_mode mode)

{
  int cols;
  long lVar1;
  long lVar2;
  int *piVar3;
  int rows;
  long lVar4;
  Data2D<double> pv;
  allocator_type local_51;
  long local_50;
  long local_48;
  vector<double,_std::allocator<double>_> local_40;
  
  if (mode == needed) {
    lVar1 = TasGrid::TasmanianSparseGrid::getNeededIndexes();
  }
  else {
    lVar1 = TasGrid::TasmanianSparseGrid::getPointsIndexes();
  }
  lVar4 = *(long *)&this->field_0x8;
  if (mode == needed) {
    if (lVar4 != 0) {
      rows = *(int *)(lVar4 + 0x48);
      goto LAB_00132699;
    }
  }
  else if (lVar4 != 0) {
    piVar3 = (int *)(lVar4 + 0x20);
    if (*(long *)(lVar4 + 0x28) == *(long *)(lVar4 + 0x30)) {
      piVar3 = (int *)(lVar4 + 0x48);
    }
    rows = *piVar3;
    goto LAB_00132699;
  }
  rows = 0;
LAB_00132699:
  local_50 = (long)this->num_dimensions;
  lVar4 = (long)rows;
  local_48 = lVar4;
  std::vector<double,_std::allocator<double>_>::vector(&local_40,local_50 * lVar4,&local_51);
  cols = this->num_dimensions;
  if ((long)cols != 0 && lVar4 != 0) {
    lVar2 = 0;
    do {
      *(double *)
       ((long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar2 * 2) = (double)*(int *)(lVar1 + lVar2);
      lVar2 = lVar2 + 4;
    } while (lVar4 * cols * 4 != lVar2);
  }
  writeMatrix(this,&this->outfilename,rows,cols,
              local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  printMatrix(this,rows,this->num_dimensions,
              local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start,false);
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TasgridWrapper::outputIndexes(output_points_mode mode) const{
    const int *p = (mode == output_points_mode::needed) ? grid.getNeededIndexes() : grid.getPointsIndexes();
    int num_points = (mode == output_points_mode::needed) ? grid.getNumNeeded() : grid.getNumPoints();
    Data2D<double> pv(num_dimensions, num_points);
    std::transform(p, p + Utils::size_mult(num_points, num_dimensions), pv.getStrip(0), [](int i)->double{ return double(i); });

    writeMatrix(outfilename, num_points, num_dimensions, pv.getStrip(0));
    printMatrix(num_points, num_dimensions, pv.getStrip(0));
}